

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testJacobiEigenSolver.cpp
# Opt level: O0

void testJacobiEigenSolver<Imath_3_2::Matrix33<double>>(Matrix33<double> *A)

{
  uint uVar1;
  double *pdVar2;
  Matrix33<double> *in_RDI;
  Matrix33<double> *pMVar3;
  double extraout_XMM0_Qa;
  Matrix33<double> *extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  uint j_1;
  uint i_1;
  Matrix33<double> MA;
  uint j;
  uint i;
  Matrix33<double> MS;
  Matrix33<double> V;
  TV S;
  Matrix33<double> AA;
  T threshold;
  undefined4 in_stack_fffffffffffffdf8;
  uint uVar4;
  undefined4 in_stack_fffffffffffffdfc;
  Matrix33<double> *in_stack_fffffffffffffe00;
  Matrix33<double> *v;
  Vec3<double> *in_stack_fffffffffffffe08;
  undefined4 in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe14;
  uint local_1e8;
  uint local_1e4;
  BaseType_conflict3 in_stack_fffffffffffffe88;
  Matrix33<double> *in_stack_fffffffffffffe90;
  Matrix33<double> local_150;
  uint local_108;
  uint local_104;
  Matrix33<double> local_100;
  Matrix33<double> local_b8;
  Vec3<double> local_70;
  Matrix33<double> local_58;
  BaseType_conflict3 local_10;
  Matrix33<double> *local_8;
  
  local_8 = in_RDI;
  local_10 = computeThreshold<Imath_3_2::Matrix33<double>>
                       ((Matrix33<double> *)
                        CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
  Imath_3_2::Matrix33<double>::Matrix33(&local_58,local_8);
  Imath_3_2::Vec3<double>::Vec3(&local_70);
  Imath_3_2::Matrix33<double>::Matrix33(&local_b8);
  Imath_3_2::jacobiEigenSolver<double>
            ((Matrix33<double> *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
             in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
  verifyOrthonormal<Imath_3_2::Matrix33<double>>
            (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  pMVar3 = &local_b8;
  Imath_3_2::Matrix33<double>::determinant(pMVar3);
  std::abs((int)pMVar3);
  if (local_10 <= extraout_XMM0_Qa - 1.0) {
    __assert_fail("abs (V.determinant ()) - 1 < threshold",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testJacobiEigenSolver.cpp"
                  ,0x67,"void testJacobiEigenSolver(const TM &) [TM = Imath_3_2::Matrix33<double>]")
    ;
  }
  Imath_3_2::Matrix33<double>::Matrix33(&local_100);
  local_104 = 0;
  while( true ) {
    uVar4 = local_104;
    uVar1 = Imath_3_2::Matrix33<double>::dimensions();
    if (uVar1 <= uVar4) break;
    local_108 = 0;
    while( true ) {
      uVar4 = local_108;
      uVar1 = Imath_3_2::Matrix33<double>::dimensions();
      if (uVar1 <= uVar4) break;
      if (local_104 == local_108) {
        pdVar2 = Imath_3_2::Vec3<double>::operator[](&local_70,local_104);
        in_stack_fffffffffffffe08 = (Vec3<double> *)*pdVar2;
        pdVar2 = Imath_3_2::Matrix33<double>::operator[](&local_100,local_104);
        pdVar2[local_108] = (double)in_stack_fffffffffffffe08;
      }
      else {
        pdVar2 = Imath_3_2::Matrix33<double>::operator[](&local_100,local_104);
        pdVar2[local_108] = 0.0;
      }
      local_108 = local_108 + 1;
    }
    local_104 = local_104 + 1;
  }
  pMVar3 = local_8;
  Imath_3_2::Matrix33<double>::determinant(local_8);
  std::abs((int)pMVar3);
  pMVar3 = &local_100;
  v = extraout_XMM0_Qa_00;
  Imath_3_2::Matrix33<double>::determinant(pMVar3);
  std::abs((int)pMVar3);
  if ((double)v - extraout_XMM0_Qa_01 < local_10) {
    Imath_3_2::Matrix33<double>::operator*((Matrix33<double> *)in_stack_fffffffffffffe08,v);
    Imath_3_2::Matrix33<double>::transposed
              ((Matrix33<double> *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
    Imath_3_2::Matrix33<double>::operator*((Matrix33<double> *)in_stack_fffffffffffffe08,v);
    local_1e4 = 0;
    do {
      uVar4 = local_1e4;
      uVar1 = Imath_3_2::Matrix33<double>::dimensions();
      if (uVar1 <= uVar4) {
        return;
      }
      local_1e8 = 0;
      while( true ) {
        uVar4 = local_1e8;
        uVar1 = Imath_3_2::Matrix33<double>::dimensions();
        if (uVar1 <= uVar4) break;
        Imath_3_2::Matrix33<double>::operator[](local_8,local_1e4);
        pMVar3 = &local_150;
        Imath_3_2::Matrix33<double>::operator[](pMVar3,local_1e4);
        std::abs((int)pMVar3);
        if (local_10 <= extraout_XMM0_Qa_02) {
          __assert_fail("abs (A[i][j] - MA[i][j]) < threshold",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testJacobiEigenSolver.cpp"
                        ,0x79,
                        "void testJacobiEigenSolver(const TM &) [TM = Imath_3_2::Matrix33<double>]")
          ;
        }
        local_1e8 = local_1e8 + 1;
      }
      local_1e4 = local_1e4 + 1;
    } while( true );
  }
  __assert_fail("abs (A.determinant ()) - abs (MS.determinant ()) < threshold",
                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testJacobiEigenSolver.cpp"
                ,0x72,"void testJacobiEigenSolver(const TM &) [TM = Imath_3_2::Matrix33<double>]");
}

Assistant:

void
testJacobiEigenSolver (const TM& A)
{
    using std::abs;

    typedef typename TM::BaseType    T;
    typedef typename TM::BaseVecType TV;

    const T threshold = computeThreshold (A);

    TM AA (A);
    TV S;
    TM V;

    jacobiEigenSolver (AA, S, V);

    // Orthogonality of V
    verifyOrthonormal (V, threshold);

    // Determinant of V
    assert (abs (V.determinant ()) - 1 < threshold);

    // Determinant of A and S
    TM MS;
    for (unsigned int i = 0; i < TM::dimensions (); ++i)
        for (unsigned int j = 0; j < TM::dimensions (); ++j)
            if (i == j)
                MS[i][j] = S[i];
            else
                MS[i][j] = 0;

    assert (abs (A.determinant ()) - abs (MS.determinant ()) < threshold);

    // A = V * S * V^T
    TM MA = V * MS * V.transposed ();

    for (unsigned int i = 0; i < TM::dimensions (); ++i)
        for (unsigned int j = 0; j < TM::dimensions (); ++j)
            assert (abs (A[i][j] - MA[i][j]) < threshold);
}